

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::dht_stats_alert,libtorrent::aux::stack_allocator&,std::vector<libtorrent::dht_routing_bucket,std::allocator<libtorrent::dht_routing_bucket>>,std::vector<libtorrent::dht_lookup,std::allocator<libtorrent::dht_lookup>>,libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,
          vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
          *args_1,vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *args_2,
          digest32<160L> *args_3,basic_endpoint<boost::asio::ip::udp> *args_4)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Head_base<0UL,_char_*,_false> _Var3;
  undefined8 uVar4;
  long lVar5;
  uint uVar6;
  dht_stats_alert *this_00;
  vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_> local_b8;
  ushort *local_a0;
  vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68;
  data_union local_58;
  
  lVar5 = (long)this->m_size;
  if ((ulong)(long)this->m_capacity < lVar5 + 0x88U) {
    grow_capacity(this,0x88);
    lVar5 = (long)this->m_size;
  }
  _Var3._M_head_impl =
       (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
       super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  local_a0 = (ushort *)(_Var3._M_head_impl + lVar5);
  uVar6 = -(int)local_a0 - 0x10U & 7;
  _Var3._M_head_impl[lVar5 + 2] = (char)uVar6;
  *(code **)(_Var3._M_head_impl + lVar5 + 8) = move<libtorrent::dht_stats_alert>;
  this_00 = (dht_stats_alert *)((long)local_a0 + (ulong)uVar6 + 0x10);
  *(ushort *)(_Var3._M_head_impl + lVar5) = -(short)this_00 - 0x70U & 7 | 0x70;
  local_b8.
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_1->
       super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_1->
       super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_b8.
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->
       super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (args_2->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (args_2->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_2->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>)
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_2->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_2->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_2->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = (args_3->m_number)._M_elems[4];
  local_78 = *(undefined8 *)(args_3->m_number)._M_elems;
  uStack_70 = *(undefined8 *)((args_3->m_number)._M_elems + 2);
  local_58._0_8_ = *(undefined8 *)&(args_4->impl_).data_;
  uVar4 = *(undefined8 *)((long)&(args_4->impl_).data_ + 0xc);
  local_58._20_8_ = *(undefined8 *)((long)&(args_4->impl_).data_ + 0x14);
  local_58._8_4_ = (undefined4)*(undefined8 *)((long)&(args_4->impl_).data_ + 8);
  local_58._12_4_ = (undefined4)uVar4;
  local_58._16_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  dht_stats_alert::dht_stats_alert
            (this_00,args,&local_b8,&local_98,
             (array<unsigned_int,_5UL>)*(array<unsigned_int,_5UL> *)(args_3->m_number)._M_elems,
             (endpoint *)&local_58.base);
  if (local_98.super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.
      super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar1 = this->m_size;
  uVar2 = this->m_num_items;
  this->m_size = uVar6 + 0x10 + (uint)*local_a0 + uVar1;
  this->m_num_items = uVar2 + 1;
  return this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}